

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitArrayNewElem(BinaryInstWriter *this,ArrayNewElem *curr)

{
  BufferWithRandomAccess *pBVar1;
  WasmBinaryWriter *this_00;
  uint32_t value;
  U32LEB local_2c;
  uintptr_t local_28;
  U32LEB local_1c;
  ArrayNewElem *local_18;
  ArrayNewElem *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (ArrayNewElem *)this;
  BufferWithRandomAccess::operator<<(this->o,-5);
  pBVar1 = this->o;
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,10);
  BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  this_00 = this->parent;
  local_28 = (uintptr_t)
             wasm::Type::getHeapType
                       (&(local_18->super_SpecificExpression<(wasm::Expression::Id)72>).
                         super_Expression.type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,(HeapType)local_28);
  pBVar1 = this->o;
  value = WasmBinaryWriter::getElementSegmentIndex
                    (this->parent,(Name)(local_18->segment).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,value);
  BufferWithRandomAccess::operator<<(pBVar1,local_2c);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNewElem(ArrayNewElem* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayNewElem);
  parent.writeIndexedHeapType(curr->type.getHeapType());
  o << U32LEB(parent.getElementSegmentIndex(curr->segment));
}